

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.h
# Opt level: O0

cmCommand * __thiscall cmQTWrapCPPCommand::Clone(cmQTWrapCPPCommand *this)

{
  cmCommand *this_00;
  cmQTWrapCPPCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmQTWrapCPPCommand((cmQTWrapCPPCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmQTWrapCPPCommand;
    }